

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay_linux.hpp
# Opt level: O0

void __thiscall ProcessProgress::heartbeat(ProcessProgress *this)

{
  int iVar1;
  undefined1 local_30 [8];
  itimerspec spec;
  ProcessProgress *this_local;
  
  if (-1 < this->watchdog_timer_fd) {
    this->heartbeats = this->heartbeats + 1;
    spec.it_value.tv_nsec = (__syscall_slong_t)this;
    memset(local_30,0,0x20);
    spec.it_interval.tv_nsec = 10;
    iVar1 = timerfd_settime(this->watchdog_timer_fd,0,(itimerspec *)local_30,(itimerspec *)0x0);
    if (iVar1 < 0) {
      fprintf(_stderr,"Fossilize ERROR: Failed to set time with timerfd_settime.\n");
      fflush(_stderr);
    }
  }
  return;
}

Assistant:

void ProcessProgress::heartbeat()
{
	if (watchdog_timer_fd >= 0)
	{
		heartbeats++;
		// Rearm timer
		struct itimerspec spec = {};
		spec.it_value.tv_sec = 10;
		if (timerfd_settime(watchdog_timer_fd, 0, &spec, nullptr) < 0)
			LOGE("Failed to set time with timerfd_settime.\n");
	}
}